

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

void __thiscall jrtplib::RTPSources::ClearSourceList(RTPSources *this)

{
  RTPInternalSourceData *pRVar1;
  RTPMemoryManager *pRVar2;
  HashElement *pHVar3;
  HashElement *pHVar4;
  
  pHVar4 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar4;
  if (pHVar4 == (HashElement *)0x0) {
    memset((this->sourcelist).table,0,0x103e8);
  }
  else {
    do {
      pRVar1 = pHVar4->element;
      pRVar2 = (this->super_RTPMemoryObject).mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        if (pRVar1 != (RTPInternalSourceData *)0x0) {
          (*(pRVar1->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject[1])(pRVar1);
        }
      }
      else {
        (**(pRVar1->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject)(pRVar1);
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2);
      }
      pHVar4 = (this->sourcelist).curhashelem;
      if (pHVar4 == (HashElement *)0x0) break;
      pHVar4 = pHVar4->listnext;
      (this->sourcelist).curhashelem = pHVar4;
    } while (pHVar4 != (HashElement *)0x0);
    pHVar4 = (this->sourcelist).firsthashelem;
    memset((this->sourcelist).table,0,0x103e8);
    while (pHVar4 != (HashElement *)0x0) {
      pHVar3 = pHVar4->listnext;
      pRVar2 = (this->sourcelist).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        operator_delete(pHVar4,0x30);
        pHVar4 = pHVar3;
      }
      else {
        (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pHVar4);
        pHVar4 = pHVar3;
      }
    }
  }
  (this->sourcelist).firsthashelem = (HashElement *)0x0;
  (this->sourcelist).lasthashelem = (HashElement *)0x0;
  this->owndata = (RTPInternalSourceData *)0x0;
  this->sendercount = 0;
  this->totalcount = 0;
  this->activecount = 0;
  return;
}

Assistant:

void RTPSources::ClearSourceList()
{
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *sourcedata;

		sourcedata = sourcelist.GetCurrentElement();
		RTPDelete(sourcedata,GetMemoryManager());
		sourcelist.GotoNextElement();
	}
	sourcelist.Clear();
	owndata = 0;
	totalcount = 0;
	sendercount = 0;
	activecount = 0;
}